

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::orthosphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double aheight,
          double bheight,double cheight,double dheight,double *orthocent,double *radius)

{
  bool bVar1;
  double dVar2;
  int local_128 [2];
  int indx [4];
  double local_110;
  double D;
  double rhs [4];
  double A [4] [4];
  double *orthocent_local;
  double dheight_local;
  double cheight_local;
  double bheight_local;
  double aheight_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  tetgenmesh *this_local;
  
  rhs[3] = 1.0;
  D = aheight * 0.5;
  rhs[0] = bheight * 0.5;
  rhs[1] = cheight * 0.5;
  rhs[2] = dheight * 0.5;
  bVar1 = lu_decmp(this,(double (*) [4])(rhs + 3),4,local_128,&local_110,0);
  if (bVar1) {
    lu_solve(this,(double (*) [4])(rhs + 3),4,local_128,&D,0);
    if (orthocent != (double *)0x0) {
      *orthocent = rhs[0];
      orthocent[1] = rhs[1];
      orthocent[2] = rhs[2];
    }
    if (radius != (double *)0x0) {
      dVar2 = sqrt(D + D + rhs[2] * rhs[2] + rhs[0] * rhs[0] + rhs[1] * rhs[1]);
      *radius = dVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    if (radius != (double *)0x0) {
      *radius = 0.0;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenmesh::orthosphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd,
                             REAL  aheight, REAL bheight, REAL cheight, 
                             REAL  dheight, REAL* orthocent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Set the coefficient matrix A (4 x 4).
  A[0][0] = 1.0; A[0][1] = pa[0]; A[0][2] = pa[1]; A[0][3] = pa[2];
  A[1][0] = 1.0; A[1][1] = pb[0]; A[1][2] = pb[1]; A[1][3] = pb[2];
  A[2][0] = 1.0; A[2][1] = pc[0]; A[2][2] = pc[1]; A[2][3] = pc[2];
  A[3][0] = 1.0; A[3][1] = pd[0]; A[3][2] = pd[1]; A[3][3] = pd[2];

  // Set the right hand side vector (4 x 1).
  rhs[0] = 0.5 * aheight;
  rhs[1] = 0.5 * bheight;
  rhs[2] = 0.5 * cheight;
  rhs[3] = 0.5 * dheight;

  // Solve the 4 by 4 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 4, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }
  lu_solve(A, 4, indx, rhs, 0);

  if (orthocent != (REAL *) NULL) {
    orthocent[0] = rhs[1];
    orthocent[1] = rhs[2];
    orthocent[2] = rhs[3];
  }
  if (radius != (REAL *) NULL) {
    // rhs[0] = - rheight / 2;
    // rheight  = - 2 * rhs[0];
    //          =  r[0]^2 + r[1]^2 + r[2]^2 - radius^2
    // radius^2 = r[0]^2 + r[1]^2 + r[2]^2 -rheight
    //          = r[0]^2 + r[1]^2 + r[2]^2 + 2 * rhs[0]
    *radius = sqrt(rhs[1] * rhs[1] + rhs[2] * rhs[2] + rhs[3] * rhs[3]
                   + 2.0 * rhs[0]);
  }
  return true;
}